

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

FlattenTo2DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_flattento2d(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x46a) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x46a;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    FlattenTo2DLayerParams::FlattenTo2DLayerParams(this_00.flattento2d_);
    (this->layer_).flattento2d_ = (FlattenTo2DLayerParams *)this_00;
  }
  return (FlattenTo2DLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::FlattenTo2DLayerParams* NeuralNetworkLayer::mutable_flattento2d() {
  if (!has_flattento2d()) {
    clear_layer();
    set_has_flattento2d();
    layer_.flattento2d_ = new ::CoreML::Specification::FlattenTo2DLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.flattenTo2D)
  return layer_.flattento2d_;
}